

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_remove<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>(int iters)

{
  int in_EDI;
  char *unaff_retaddr;
  double ut;
  int i;
  Rusage t;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type *in_stack_ffffffffffffff58;
  HashObject<8,_8> *in_stack_ffffffffffffff60;
  Rusage *in_stack_ffffffffffffff70;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *in_stack_ffffffffffffff80;
  int local_78;
  size_t in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            (in_stack_ffffffffffffff80);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff60);
  for (local_78 = 0; local_78 < in_EDI; local_78 = local_78 + 1) {
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    in_stack_ffffffffffffff60 =
         (HashObject<8,_8> *)
         google::
         sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::operator[]((sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                       *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60->i_ = local_78 + 1;
  }
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff60);
  for (local_78 = 0; local_78 < in_EDI; local_78 = local_78 + 1) {
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    google::
    sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  Rusage::UserTime(in_stack_ffffffffffffff70);
  report(unaff_retaddr,(double)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
         in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::~EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d76e3);
  return;
}

Assistant:

static void time_map_remove(int iters) {
  MapType set;
  Rusage t;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  t.Reset();
  for (i = 0; i < iters; i++) {
    set.erase(i);
  }
  double ut = t.UserTime();

  report("map_remove", ut, iters, 0, 0);
}